

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ltable.c
# Opt level: O2

uint binsearch(TValue *array,uint i,uint j)

{
  uint uVar1;
  
  while (uVar1 = i, 1 < j - uVar1) {
    i = uVar1 + j >> 1;
    if ((array[i - 1].tt_ & 0xf) == 0) {
      j = i;
      i = uVar1;
    }
  }
  return uVar1;
}

Assistant:

static unsigned int binsearch (const TValue *array, unsigned int i,
                                                    unsigned int j) {
  while (j - i > 1u) {  /* binary search */
    unsigned int m = (i + j) / 2;
    if (isempty(&array[m - 1])) j = m;
    else i = m;
  }
  return i;
}